

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 jx9MemObjToHashmap(jx9_value *pObj)

{
  uint uVar1;
  jx9_hashmap *pMap;
  _func_sxu32_void_ptr_sxu32 *in_RDX;
  sxi32 sVar2;
  _func_sxu32_sxi64 *in_RSI;
  
  sVar2 = 0;
  if ((pObj->iFlags & 0x40) == 0) {
    pMap = jx9NewHashmap(pObj->pVm,in_RSI,in_RDX);
    if (pMap == (jx9_hashmap *)0x0) {
      sVar2 = -1;
    }
    else {
      uVar1 = pObj->iFlags;
      if ((uVar1 & 0x120) == 0) {
        HashmapInsert(pMap,(jx9_value *)0x0,pObj);
        SyBlobRelease(&pObj->sBlob);
        uVar1 = pObj->iFlags;
      }
      pObj->iFlags = uVar1 & 0xfffffe90 | 0x40;
      (pObj->x).pOther = pMap;
      sVar2 = 0;
    }
  }
  return sVar2;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjToHashmap(jx9_value *pObj)
{
	if( (pObj->iFlags & MEMOBJ_HASHMAP) == 0 ){
		jx9_hashmap *pMap;
		/* Allocate a new hashmap instance */
		pMap = jx9NewHashmap(pObj->pVm, 0, 0);
		if( pMap == 0 ){
			return SXERR_MEM;
		}
		if( (pObj->iFlags & (MEMOBJ_NULL|MEMOBJ_RES)) == 0 ){
			/* 
			 * According to the JX9 language reference manual.
			 *   For any of the types: integer, float, string, boolean converting a value
			 *   to an array results in an array with a single element with index zero 
			 *   and the value of the scalar which was converted.
			 */
			/* Insert a single element */
			jx9HashmapInsert(pMap, 0/* Automatic index assign */, &(*pObj));
			SyBlobRelease(&pObj->sBlob);
		}
		/* Invalidate any prior representation */
		MemObjSetType(pObj, MEMOBJ_HASHMAP);
		pObj->x.pOther = pMap;
	}
	return SXRET_OK;
}